

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O1

void __thiscall nuraft::rpc_session::prepare_handshake(rpc_session *this)

{
  element_type *peVar1;
  int iVar2;
  undefined8 this_00;
  ptr<rpc_session> self;
  element_type *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Head_base<0UL,_nuraft::rpc_session_*,_false> local_70;
  ssl_socket *local_68;
  anon_union_16_3_a3f0114d_for___in6_u local_60;
  uint32_t local_50;
  ptr<rpc_session> local_48;
  data_union local_34;
  
  std::__shared_ptr<nuraft::rpc_session,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<nuraft::rpc_session,void>
            ((__shared_ptr<nuraft::rpc_session,(__gnu_cxx::_Lock_policy)2> *)&local_a0,
             (__weak_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2> *)this);
  asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::remote_endpoint
            ((endpoint_type *)&local_34.base,
             &(this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>);
  if (local_34.base.sa_family == 2) {
    local_68 = (ssl_socket *)((ulong)local_34.v6.sin6_flowinfo << 0x20);
    local_60.__u6_addr8[0] = '\0';
    local_60.__u6_addr8[1] = '\0';
    local_60.__u6_addr8[2] = '\0';
    local_60.__u6_addr8[3] = '\0';
    local_60.__u6_addr8[4] = '\0';
    local_60.__u6_addr8[5] = '\0';
    local_60.__u6_addr8[6] = '\0';
    local_60.__u6_addr8[7] = '\0';
    local_60._8_8_ = 0;
    local_50 = 0;
  }
  else {
    local_60.__u6_addr8[0] = local_34.base.sa_data[6];
    local_60.__u6_addr8[1] = local_34.base.sa_data[7];
    local_60.__u6_addr8[2] = local_34.base.sa_data[8];
    local_60.__u6_addr8[3] = local_34.base.sa_data[9];
    local_60.__u6_addr8[4] = local_34.base.sa_data[10];
    local_60.__u6_addr8[5] = local_34.base.sa_data[0xb];
    local_60.__u6_addr8[6] = local_34.base.sa_data[0xc];
    local_60.__u6_addr8[7] = local_34.base.sa_data[0xd];
    local_60._8_8_ = local_34._16_8_;
    local_68 = (ssl_socket *)0x1;
    local_50 = local_34.v6.sin6_scope_id;
  }
  asio::ip::address::to_string_abi_cxx11_((string *)local_90,(address *)&local_68);
  std::__cxx11::string::operator=((string *)&this->cached_address_,(string *)local_90);
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_);
  }
  asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::remote_endpoint
            ((endpoint_type *)local_90,
             &(this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>);
  this->cached_port_ = (uint)(ushort)(local_90._2_2_ << 8 | (ushort)local_90._2_2_ >> 8);
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar2 = (**(code **)(*(long *)peVar1 + 0x38))();
    if (3 < iVar2) {
      peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_90,"session %lu got connection from %s:%u (as a server)",
                 this->session_id_,(this->cached_address_)._M_dataplus._M_p,
                 (ulong)this->cached_port_);
      (**(code **)(*(long *)peVar1 + 0x40))
                (peVar1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                 ,"prepare_handshake",0x106,local_90);
      if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
        operator_delete((void *)local_90._0_8_);
      }
    }
  }
  if (this->ssl_enabled_ == true) {
    local_90._0_8_ = handle_handshake;
    local_90[8] = '\0';
    local_90[9] = '\0';
    local_90[10] = '\0';
    local_90[0xb] = '\0';
    local_90[0xc] = '\0';
    local_90[0xd] = '\0';
    local_90[0xe] = '\0';
    local_90[0xf] = '\0';
    local_80._M_allocated_capacity = (size_type)local_a0;
    local_80._8_8_ = local_98;
    if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_98->_M_use_count = local_98->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_98->_M_use_count = local_98->_M_use_count + 1;
      }
    }
    local_68 = &this->ssl_socket_;
    local_70._M_head_impl = this;
    asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>::
    initiate_async_handshake::operator()
              (&local_68,
               (_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>
                *)local_90,server);
    this_00 = local_80._8_8_;
  }
  else {
    local_48.super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_a0;
    local_48.super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_98;
    if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_98->_M_use_count = local_98->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_98->_M_use_count = local_98->_M_use_count + 1;
      }
    }
    start(this,&local_48);
    this_00 = local_48.super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  return;
}

Assistant:

void prepare_handshake() {
        // this is safe since we only expose ctor to cs_new
        ptr<rpc_session> self = this->shared_from_this();

        cached_address_ = socket_.remote_endpoint().address().to_string();
        cached_port_ = socket_.remote_endpoint().port();
        p_in( "session %" PRIu64 " got connection from %s:%u (as a server)",
              session_id_,
              cached_address_.c_str(),
              cached_port_ );

        if (ssl_enabled_) {
#ifdef SSL_LIBRARY_NOT_FOUND
            assert(0); // Should not reach here.
#else
            ssl_socket_.async_handshake
                ( asio::ssl::stream_base::server,
                  std::bind( &rpc_session::handle_handshake,
                             this,
                             self,
                             std::placeholders::_1 ) );
#endif
        } else {
            this->start(self);
        }
    }